

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SstWriter.cpp
# Opt level: O3

void __thiscall adios2::core::engine::SstWriter::DestructorClose(SstWriter *this,bool Verbose)

{
  ostream *poVar1;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,Verbose) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"SST Writer \"",0xc);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(this->super_Engine).m_Name._M_dataplus._M_p,
                        (this->super_Engine).m_Name._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"\" Destroyed without a prior Close().",0x24);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "This may result in loss of data and/or disconnect warnings for a connected SST Reader."
               ,0x56);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
  }
  (this->super_Engine).m_IsOpen = false;
  return;
}

Assistant:

void SstWriter::DestructorClose(bool Verbose) noexcept
{
    if (Verbose)
    {
        std::cerr << "SST Writer \"" << m_Name << "\" Destroyed without a prior Close()."
                  << std::endl;
        std::cerr << "This may result in loss of data and/or disconnect "
                     "warnings for a connected SST Reader."
                  << std::endl;
    }
    m_IsOpen = false;
    // should at least call control plane to remove contact file
}